

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O2

void __thiscall
level_mesh::push(level_mesh *this,uint16_t sector,xr_vbuf *vb,xr_ibuf *ib,uint16_t texture,
                uint16_t eshader,fmatrix *xform)

{
  b_face local_70;
  
  xray_re::xr_mesh_builder::b_face::b_face(&local_70,sector);
  local_70.field_1.field_1.sgroup = CONCAT22((short)((vb->m_signature & 8) >> 1),0xffff) | 0x20000;
  local_70.field_1.field_1.surf_idx._0_2_ = texture;
  local_70.field_1.field_1.surf_idx._2_2_ = eshader;
  xray_re::xr_mesh_builder::__push(&this->super_xr_mesh_builder,vb,ib,xform,&local_70,0);
  return;
}

Assistant:

void level_mesh::push(uint16_t sector, const xr_vbuf& vb, const xr_ibuf& ib,
	uint16_t texture, uint16_t eshader, const fmatrix& xform)
{
	b_face face_template(sector);
	face_template.surface.set(texture, eshader);
	if (vb.has_lightmaps())
		face_template.surface.flags |= RSF_LIGHTMAP;
	xr_mesh_builder::__push(vb, ib, &xform, face_template);
}